

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall chrono::ChBody::RemoveCollisionModelsFromSystem(ChBody *this)

{
  ChSystem *pCVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  
  if ((this->super_ChPhysicsItem).system == (ChSystem *)0x0) {
    __assert_fail("this->GetSystem()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBody.cpp"
                  ,0x323,"virtual void chrono::ChBody::RemoveCollisionModelsFromSystem()");
  }
  iVar3 = (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[10])();
  if ((char)iVar3 != '\0') {
    pCVar1 = (this->super_ChPhysicsItem).system;
    peVar2 = (pCVar1->collision_system).
             super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    this_00 = (pCVar1->collision_system).
              super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    (*peVar2->_vptr_ChCollisionSystem[5])
              (peVar2,(this->collision_model).
                      super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
  return;
}

Assistant:

void ChBody::RemoveCollisionModelsFromSystem() {
    assert(this->GetSystem());
    if (this->GetCollide())
        this->GetSystem()->GetCollisionSystem()->Remove(collision_model.get());
}